

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

xmlTextReaderPtr xmlReaderForDoc(xmlChar *cur,char *URL,char *encoding,int options)

{
  int size;
  xmlTextReaderPtr pxVar1;
  
  if (cur != (xmlChar *)0x0) {
    size = xmlStrlen(cur);
    pxVar1 = xmlReaderForMemory((char *)cur,size,URL,encoding,options);
    return pxVar1;
  }
  return (xmlTextReaderPtr)0x0;
}

Assistant:

xmlTextReaderPtr
xmlReaderForDoc(const xmlChar * cur, const char *URL, const char *encoding,
                int options)
{
    int len;

    if (cur == NULL)
        return (NULL);
    len = xmlStrlen(cur);

    return (xmlReaderForMemory
            ((const char *) cur, len, URL, encoding, options));
}